

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

RangeSelectSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::RangeSelectSyntax,slang::syntax::RangeSelectSyntax_const&>
          (BumpAllocator *this,RangeSelectSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  ExpressionSyntax *pEVar3;
  Info *pIVar4;
  undefined4 uVar5;
  TokenKind TVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  RangeSelectSyntax *pRVar10;
  
  pRVar10 = (RangeSelectSyntax *)allocate(this,0x38,8);
  uVar5 = *(undefined4 *)&(args->super_SelectorSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_SelectorSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_SelectorSyntax).super_SyntaxNode.previewNode;
  pEVar3 = (args->left).ptr;
  TVar6 = (args->range).kind;
  uVar7 = (args->range).field_0x2;
  NVar8.raw = (args->range).numFlags.raw;
  uVar9 = (args->range).rawLen;
  pIVar4 = (args->range).info;
  (pRVar10->super_SelectorSyntax).super_SyntaxNode.kind =
       (args->super_SelectorSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pRVar10->super_SelectorSyntax).super_SyntaxNode.field_0x4 = uVar5;
  (pRVar10->super_SelectorSyntax).super_SyntaxNode.parent = pSVar1;
  (pRVar10->super_SelectorSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pRVar10->left).ptr = pEVar3;
  (pRVar10->range).kind = TVar6;
  (pRVar10->range).field_0x2 = uVar7;
  (pRVar10->range).numFlags = (NumericTokenFlags)NVar8.raw;
  (pRVar10->range).rawLen = uVar9;
  (pRVar10->range).info = pIVar4;
  (pRVar10->right).ptr = (args->right).ptr;
  return pRVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }